

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O1

void duckdb::Leaf::TransformToNested(ART *art,Node *node)

{
  byte *pbVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  ulong uVar3;
  Node *pNVar4;
  ARTConflictType AVar5;
  Allocator *allocator_00;
  type paVar6;
  long *plVar7;
  pointer this;
  data_ptr_t pdVar8;
  ulong *data;
  InternalException *this_00;
  __hash_code __code;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  IndexPointer local_c0;
  Node *local_b8;
  shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
  *local_b0;
  string local_a8;
  ARTKey row_id;
  ArenaAllocator allocator;
  
  allocator_00 = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
  local_c0.data = 0;
  uVar10 = (node->super_IndexPointer).data;
  local_b8 = node;
  if (uVar10 >> 0x38 != 0) {
    local_b0 = &art->allocators;
    do {
      paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(local_b0);
      _Var2._M_head_impl =
           paVar6->_M_elems[1].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar7 = *(long **)(*(long *)&((_Var2._M_head_impl)->buffers)._M_h +
                         ((uVar10 & 0xffffffff) %
                         *(size_type *)((long)&(_Var2._M_head_impl)->buffers + 8)) * 8);
      for (plVar9 = (long *)*plVar7; (uVar10 & 0xffffffff) != plVar9[1]; plVar9 = (long *)*plVar9) {
        plVar7 = plVar9;
      }
      this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar7 + 0x10));
      pdVar8 = FixedSizeBuffer::Get(this,false);
      lVar11 = (ulong)((uint)(uVar10 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
      pbVar1 = pdVar8 + (_Var2._M_head_impl)->bitmask_offset + lVar11;
      if (pdVar8[(_Var2._M_head_impl)->bitmask_offset + lVar11] != '\0') {
        uVar10 = 0;
        do {
          uVar3 = *(ulong *)(pbVar1 + uVar10 * 8 + 8);
          data = (ulong *)ArenaAllocator::Allocate(&allocator,8);
          *data = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                  | uVar3 << 0x38;
          *(data_t *)data = (char)(uVar3 >> 0x38) + 0x80;
          ARTKey::ARTKey((ARTKey *)&local_a8,(data_ptr_t)data,8);
          row_id.len = (idx_t)local_a8._M_dataplus._M_p;
          row_id.data = (data_ptr_t)local_a8._M_string_length;
          AVar5 = ART::Insert(art,(Node *)&local_c0,&row_id,0,&row_id,GATE_SET,
                              (optional_ptr<duckdb::ART,_true>)0x0,INSERT_DUPLICATES);
          if (AVar5 != NO_CONFLICT) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"invalid conflict type in Leaf::TransformToNested","");
            InternalException::InternalException(this_00,&local_a8);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < *pbVar1);
      }
      uVar10 = *(ulong *)(pbVar1 + 0x28);
    } while (0xffffffffffffff < uVar10);
  }
  pNVar4 = local_b8;
  local_c0.data = local_c0.data | 0x8000000000000000;
  Node::Free(art,local_b8);
  (pNVar4->super_IndexPointer).data = local_c0.data;
  ArenaAllocator::~ArenaAllocator(&allocator);
  return;
}

Assistant:

void Leaf::TransformToNested(ART &art, Node &node) {
	D_ASSERT(node.GetType() == LEAF);

	ArenaAllocator allocator(Allocator::Get(art.db));
	Node root = Node();

	// Move all row IDs into the nested leaf.
	reference<const Node> leaf_ref(node);
	while (leaf_ref.get().HasMetadata()) {
		auto &leaf = Node::Ref<const Leaf>(art, leaf_ref, LEAF);
		for (uint8_t i = 0; i < leaf.count; i++) {
			auto row_id = ARTKey::CreateARTKey<row_t>(allocator, leaf.row_ids[i]);
			auto conflict_type =
			    art.Insert(root, row_id, 0, row_id, GateStatus::GATE_SET, nullptr, IndexAppendMode::INSERT_DUPLICATES);
			if (conflict_type != ARTConflictType::NO_CONFLICT) {
				throw InternalException("invalid conflict type in Leaf::TransformToNested");
			}
		}
		leaf_ref = leaf.ptr;
	}

	root.SetGateStatus(GateStatus::GATE_SET);
	Node::Free(art, node);
	node = root;
}